

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  bool bVar1;
  RGBColorSpace *cs;
  float fVar2;
  ulong uVar3;
  anon_class_24_3_48d30edf func;
  undefined1 auVar5 [16];
  undefined1 auVar8 [48];
  undefined1 auVar6 [64];
  undefined8 uVar15;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar20 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  RGB RVar23;
  SampledSpectrum SVar24;
  TextureEvalContext *local_b0;
  Tuple2<pbrt::Vector2,_float> **ppTStack_a8;
  Tuple2<pbrt::Vector2,_float> **local_a0;
  RGB local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Tuple2<pbrt::Vector2,_float> local_70;
  Tuple2<pbrt::Vector2,_float> local_68;
  Tuple2<pbrt::Vector2,_float> *local_60;
  TextureEvalContext local_58;
  undefined1 auVar7 [64];
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  undefined1 auVar16 [56];
  undefined1 auVar17 [64];
  
  local_98._0_8_ = &local_68;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_60 = &local_70;
  local_70.x = 0.0;
  local_70.y = 0.0;
  auVar8 = ctx._16_48_;
  local_b0 = &local_58;
  local_58 = ctx;
  ppTStack_a8 = (Tuple2<pbrt::Vector2,_float> **)&local_98;
  local_a0 = &local_60;
  func.dstdx = (Vector2f **)ppTStack_a8;
  func.ctx = local_b0;
  func.dstdy = (Vector2f **)local_a0;
  auVar11._0_8_ =
       TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
       ::
       Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                 ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   *)this,func);
  auVar11._8_56_ = extraout_var;
  auVar4 = vmovshdup_avx(auVar11._0_16_);
  auVar4 = vinsertps_avx(auVar11._0_16_,ZEXT416((uint)(1.0 - auVar4._0_4_)),0x10);
  uVar15 = auVar4._8_8_;
  local_88 = (this->super_ImageTextureBase).scale;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  RVar23 = MIPMap::Filter<pbrt::RGB>
                     ((this->super_ImageTextureBase).mipmap,(Point2f)auVar4._0_8_,(Vector2f)local_68
                      ,(Vector2f)local_70);
  auVar4._0_4_ = local_88 * RVar23.r;
  auVar4._4_4_ = fStack_84 * RVar23.g;
  auVar4._8_4_ = fStack_80 * (float)uVar15;
  auVar4._12_4_ = fStack_7c * (float)((ulong)uVar15 >> 0x20);
  fVar2 = local_88 * RVar23.b;
  vmovlps_avx(auVar4);
  bVar1 = (this->super_ImageTextureBase).invert;
  auVar9._8_4_ = 0x3f800000;
  auVar9._0_8_ = 0x3f8000003f800000;
  auVar9._12_4_ = 0x3f800000;
  auVar16 = ZEXT856(auVar9._8_8_);
  if (bVar1 != false) {
    auVar4 = vsubps_avx(auVar9,auVar4);
  }
  auVar4 = vmaxps_avx(auVar4,_DAT_003f54a0);
  auVar7._16_48_ = auVar8;
  auVar7._0_16_ = ZEXT416((uint)fVar2);
  auVar6._4_60_ = auVar7._4_60_;
  auVar6._0_4_ = (uint)(bVar1 & 1) * (int)(1.0 - fVar2) + (uint)!(bool)(bVar1 & 1) * (int)fVar2;
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  auVar22 = vmaxss_avx(auVar6._0_16_,auVar22);
  auVar20 = ZEXT856(auVar22._8_8_);
  local_b0 = (TextureEvalContext *)vmovlps_avx(auVar4);
  ppTStack_a8 = (Tuple2<pbrt::Vector2,_float> **)
                CONCAT44((int)((ulong)ppTStack_a8 >> 0x20),auVar22._0_4_);
  cs = ((this->super_ImageTextureBase).mipmap)->colorSpace;
  if (cs == (RGBColorSpace *)0x0) {
    auVar10._4_4_ = local_b0._0_4_;
    auVar10._0_4_ = local_b0._0_4_;
    auVar10._8_4_ = local_b0._0_4_;
    auVar10._12_4_ = local_b0._0_4_;
  }
  else {
    if (this->spectrumType == Albedo) {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_b0;
      uVar3 = vcmpps_avx512vl(auVar21,ZEXT416(0) << 0x20,5);
      auVar4 = vminps_avx512vl(auVar9,auVar21);
      auVar5._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar4._4_4_;
      auVar5._0_4_ = (uint)((byte)uVar3 & 1) * auVar4._0_4_;
      auVar5._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar4._8_4_;
      auVar5._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar4._12_4_;
      auVar16 = ZEXT856(auVar5._8_8_);
      auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar22);
      auVar20 = ZEXT856(auVar4._8_8_);
      local_98._0_8_ = vmovlps_avx(auVar5);
      local_98.b = auVar4._0_4_;
      RGBAlbedoSpectrum::RGBAlbedoSpectrum((RGBAlbedoSpectrum *)&local_58,cs,&local_98);
      SVar24 = RGBAlbedoSpectrum::Sample((RGBAlbedoSpectrum *)&local_58,&lambda);
      auVar18._0_8_ = SVar24.values.values._8_8_;
      auVar18._8_56_ = auVar20;
      auVar9 = auVar18._0_16_;
      auVar13._0_8_ = SVar24.values.values._0_8_;
      auVar13._8_56_ = auVar16;
      auVar4 = auVar13._0_16_;
    }
    else if (this->spectrumType == Unbounded) {
      RGBUnboundedSpectrum::RGBUnboundedSpectrum
                ((RGBUnboundedSpectrum *)&local_58,cs,(RGB *)&local_b0);
      SVar24 = RGBUnboundedSpectrum::Sample((RGBUnboundedSpectrum *)&local_58,&lambda);
      auVar17._0_8_ = SVar24.values.values._8_8_;
      auVar17._8_56_ = auVar20;
      auVar9 = auVar17._0_16_;
      auVar12._0_8_ = SVar24.values.values._0_8_;
      auVar12._8_56_ = auVar16;
      auVar4 = auVar12._0_16_;
    }
    else {
      RGBIlluminantSpectrum::RGBIlluminantSpectrum
                ((RGBIlluminantSpectrum *)&local_58,cs,(RGB *)&local_b0);
      SVar24 = RGBIlluminantSpectrum::Sample((RGBIlluminantSpectrum *)&local_58,&lambda);
      auVar19._0_8_ = SVar24.values.values._8_8_;
      auVar19._8_56_ = auVar20;
      auVar9 = auVar19._0_16_;
      auVar14._0_8_ = SVar24.values.values._0_8_;
      auVar14._8_56_ = auVar16;
      auVar4 = auVar14._0_16_;
    }
    auVar10 = vmovlhps_avx(auVar4,auVar9);
  }
  auVar4 = vshufpd_avx(auVar10,auVar10,1);
  SVar24.values.values._0_8_ = auVar10._0_8_;
  SVar24.values.values._8_8_ = auVar4._0_8_;
  return (SampledSpectrum)SVar24.values.values;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    // Apply texture mapping and flip $t$ coordinate for image texture lookup
    Vector2f dstdx, dstdy;
    Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
    st[1] = 1 - st[1];

    // Lookup filtered RGB value in _MIPMap_
    RGB rgb = scale * mipmap->Filter<RGB>(st, dstdx, dstdy);
    rgb = ClampZero(invert ? (RGB(1, 1, 1) - rgb) : rgb);

    // Return _SampledSpectrum_ for RGB image texture value
    if (const RGBColorSpace *cs = mipmap->GetRGBColorSpace(); cs != nullptr) {
        if (spectrumType == SpectrumType::Unbounded)
            return RGBUnboundedSpectrum(*cs, rgb).Sample(lambda);
        else if (spectrumType == SpectrumType::Albedo)
            return RGBAlbedoSpectrum(*cs, Clamp(rgb, 0, 1)).Sample(lambda);
        else
            return RGBIlluminantSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    DCHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);

#endif
}